

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O3

void __thiscall
FileHandlePool::FileHandlePool
          (FileHandlePool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames,int count)

{
  pointer *pppPVar1;
  pointer pbVar2;
  iterator __position;
  stat_history_t *psVar3;
  fdb_status fVar4;
  StatAggregator *this_00;
  ulong uVar5;
  fdb_file_handle *dbfile;
  PoolEntry *pe;
  fdb_kvs_handle *db;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_file_handle *local_158;
  PoolEntry *local_150;
  fdb_kvs_handle *local_148;
  fdb_kvs_config local_140;
  fdb_config local_128;
  
  this->_vptr_FileHandlePool = (_func_int **)&PTR__FileHandlePool_00157ce0;
  (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fdb_get_default_config();
  local_128.multi_kv_instances = false;
  fdb_get_default_kvs_config();
  if (0 < count) {
    uVar5 = 0;
    do {
      pbVar2 = (filenames->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      fVar4 = fdb_open(&local_158,
                       pbVar2[uVar5 % (ulong)((long)(filenames->
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)pbVar2 >> 5)]._M_dataplus._M_p,&local_128);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fdb_assert_die("status == FDB_RESULT_SUCCESS",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                       ,0x56,(long)fVar4,0);
      }
      fVar4 = fdb_kvs_open_default(local_158,&local_148,&local_140);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fdb_assert_die("status == FDB_RESULT_SUCCESS",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                       ,0x58,(long)fVar4,0);
      }
      local_150 = (PoolEntry *)operator_new(0x18);
      local_150->index = (int)uVar5;
      LOCK();
      (local_150->available)._M_base._M_i = true;
      UNLOCK();
      local_150->dbfile = local_158;
      local_150->db = local_148;
      __position._M_current =
           (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<PoolEntry*,std::allocator<PoolEntry*>>::_M_realloc_insert<PoolEntry*const&>
                  ((vector<PoolEntry*,std::allocator<PoolEntry*>> *)&this->pool_vector,__position,
                   &local_150);
      }
      else {
        *__position._M_current = local_150;
        pppPVar1 = &(this->pool_vector).
                    super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)count != uVar5);
  }
  pthread_mutex_init((pthread_mutex_t *)&this->statlock,(pthread_mutexattr_t *)0x0);
  this_00 = (StatAggregator *)operator_new(0x10);
  StatAggregator::StatAggregator(this_00,9,1);
  this->sa = this_00;
  std::__cxx11::string::_M_replace
            ((ulong)*this_00->t_stats,0,(char *)((*this_00->t_stats)->name)._M_string_length,
             0x145b2f);
  psVar3 = this->sa->t_stats[1];
  std::__cxx11::string::_M_replace((ulong)psVar3,0,(char *)(psVar3->name)._M_string_length,0x145bb6)
  ;
  psVar3 = this->sa->t_stats[2];
  std::__cxx11::string::_M_replace((ulong)psVar3,0,(char *)(psVar3->name)._M_string_length,0x1423a0)
  ;
  psVar3 = this->sa->t_stats[3];
  std::__cxx11::string::_M_replace((ulong)psVar3,0,(char *)(psVar3->name)._M_string_length,0x142379)
  ;
  psVar3 = this->sa->t_stats[5];
  std::__cxx11::string::_M_replace((ulong)psVar3,0,(char *)(psVar3->name)._M_string_length,0x142389)
  ;
  psVar3 = this->sa->t_stats[7];
  std::__cxx11::string::_M_replace((ulong)psVar3,0,(char *)(psVar3->name)._M_string_length,0x142397)
  ;
  psVar3 = this->sa->t_stats[8];
  std::__cxx11::string::_M_replace((ulong)psVar3,0,(char *)(psVar3->name)._M_string_length,0x1423a4)
  ;
  this->samples = 0;
  return;
}

Assistant:

FileHandlePool(std::vector<std::string> filenames, int count) {
        fdb_status status;
        fdb_config fconfig = fdb_get_default_config();
        fconfig.multi_kv_instances = false;
        fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
        for (int i = 0; i < count; ++i) {
            fdb_file_handle *dbfile;
            fdb_kvs_handle *db;
            status = fdb_open(&dbfile,
                              filenames.at(i % filenames.size()).c_str(),
                              &fconfig);
            fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
            status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
            fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
            PoolEntry *pe = new PoolEntry(i, true, dbfile, db);
            pool_vector.push_back(pe);
        }

        mutex_init(&statlock);

        // Set up StatAggregator
        sa = new StatAggregator(_num_stats_, 1);

        sa->t_stats[SET][0].name = "set";
        sa->t_stats[COMMIT][0].name = "commit";
        sa->t_stats[GET][0].name = "get";
        sa->t_stats[IN_MEM_SNAP][0].name = "in-mem snapshot";

        sa->t_stats[ITR_INIT][0].name = "iterator-init";
        sa->t_stats[ITR_GET][0].name = "iterator-get";
        sa->t_stats[ITR_CLOSE][0].name = "iterator-close";

        samples = 0;
    }